

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool units::cleanUnitStringPhase2(string *unit_string)

{
  char cVar1;
  long lVar2;
  size_type sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  const_iterator cVar7;
  ulong uVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  char cVar10;
  byte bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tstring;
  key_type local_60;
  size_type local_40;
  long local_38;
  
  local_40 = unit_string->_M_string_length;
  bVar11 = 0;
  lVar6 = 0;
  do {
    cVar10 = (char)unit_string;
    lVar5 = std::__cxx11::string::find
                      (cVar10,(ulong)(uint)(int)**(char **)((long)&Esegs_abi_cxx11_ + lVar6));
    lVar4 = lVar6;
    lVar2 = local_38;
    while (local_38 = lVar4, lVar5 != -1) {
      lVar6 = std::__cxx11::string::find
                        (cVar10,(ulong)(uint)(int)*(char *)(*(long *)((long)&Esegs_abi_cxx11_ +
                                                                     lVar6) + 1));
      std::__cxx11::string::substr((ulong)&local_60,(ulong)unit_string);
      cVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)modifiers_abi_cxx11_,&local_60);
      if (cVar7.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        uVar8 = std::__cxx11::string::find_first_not_of(cVar10,0x20);
        if (((uVar8 != 0xffffffffffffffff) &&
            (cVar1 = (unit_string->_M_dataplus)._M_p[uVar8], cVar1 != '*')) && (cVar1 != '/')) {
          std::__cxx11::string::insert((ulong)unit_string,uVar8,'\x01');
        }
        std::__cxx11::string::replace
                  ((ulong)unit_string,lVar5 + 1,(char *)(lVar6 - lVar5),
                   *(ulong *)((long)cVar7.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                    ._M_cur + 0x28));
        (unit_string->_M_dataplus)._M_p[lVar5] = '_';
        bVar11 = 1;
      }
      lVar6 = local_38;
      lVar5 = std::__cxx11::string::find
                        (cVar10,(ulong)(uint)(int)**(char **)((long)&Esegs_abi_cxx11_ + local_38));
      lVar4 = local_38;
      lVar2 = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_),
                        local_60.field_2._M_allocated_capacity + 1);
        lVar4 = local_38;
        lVar2 = local_38;
      }
    }
    lVar6 = lVar6 + 0x20;
    local_38 = lVar2;
  } while (lVar6 != 0x80);
  uVar8 = std::__cxx11::string::find(cVar10,0x2d);
  if (uVar8 != 0xffffffffffffffff) {
    lVar6 = std::__cxx11::string::find_first_of((char *)unit_string,0x21184f,uVar8 + 1);
    std::__cxx11::string::substr((ulong)&local_60,(ulong)unit_string);
    cVar7 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)modifiers_abi_cxx11_,&local_60);
    if (cVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      std::__cxx11::string::replace
                ((ulong)unit_string,uVar8 + 1,(char *)(~uVar8 + lVar6),
                 *(ulong *)((long)cVar7.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                  ._M_cur + 0x28));
      (unit_string->_M_dataplus)._M_p[uVar8] = '_';
      bVar11 = 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_),
                      local_60.field_2._M_allocated_capacity + 1);
    }
  }
  sVar3 = local_40;
  uVar8 = std::__cxx11::string::find(cVar10,0x2d);
  while (uVar8 != 0xffffffffffffffff) {
    if ((unit_string->_M_string_length - 1 <= uVar8) ||
       (9 < (byte)((unit_string->_M_dataplus)._M_p[uVar8 + 1] - 0x30U))) {
      std::__cxx11::string::erase((ulong)unit_string,uVar8);
    }
    uVar8 = std::__cxx11::string::find(cVar10,0x2d);
  }
  _Var9._M_current = (unit_string->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p._0_1_ = 0x2b;
  _Var9 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var9,_Var9._M_current + unit_string->_M_string_length,
                     (_Iter_equals_val<const_char>)&local_60);
  unit_string->_M_string_length = (long)_Var9._M_current - (long)(unit_string->_M_dataplus)._M_p;
  *_Var9._M_current = '\0';
  clearEmptySegments(unit_string);
  return (bool)(bVar11 | sVar3 != unit_string->_M_string_length);
}

Assistant:

static bool cleanUnitStringPhase2(std::string& unit_string)
{
    bool changed{false};
    auto len = unit_string.length();

    if (bracketModifiers(unit_string)) {
        changed = true;
    }

    // cleanup extraneous dashes
    auto dpos = unit_string.find_first_of('-');
    while (dpos != std::string::npos) {
        if (dpos < unit_string.size() - 1) {
            if (unit_string[dpos + 1] >= '0' && unit_string[dpos + 1] <= '9') {
                dpos = unit_string.find_first_of('-', dpos + 1);
                continue;
            }
        }

        unit_string.erase(dpos, 1);
        dpos = unit_string.find_first_of('-', dpos);
    }
    unit_string.erase(
        std::remove(unit_string.begin(), unit_string.end(), '+'),
        unit_string.end());

    clearEmptySegments(unit_string);

    return changed || (len != unit_string.length());
}